

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_test.c
# Opt level: O1

char * test_percentiles_by_value_at_percentiles(void)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  int64_t values [5];
  double percentiles [5];
  int64_t local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  long local_38;
  double local_28 [5];
  
  load_histograms();
  local_48 = 0;
  lStack_40 = 0;
  local_58 = 0;
  lStack_50 = 0;
  local_38 = 0;
  local_28[0] = 30.0;
  local_28[1] = 99.0;
  local_28[2] = 99.99;
  local_28[3] = 99.999;
  local_28[4] = 100.0;
  iVar2 = hdr_value_at_percentiles(raw_histogram,local_28,&local_58,5);
  if (iVar2 == 0) {
    _Var1 = compare_double((double)local_58,1000.0,1.0);
    if (_Var1) {
      _Var1 = compare_double((double)lStack_50,1000.0,1.0);
      if (_Var1) {
        _Var1 = compare_double((double)local_48,1000.0,1.0);
        if (_Var1) {
          _Var1 = compare_double((double)lStack_40,100000000.0,100000.0);
          if (_Var1) {
            _Var1 = compare_double((double)local_38,100000000.0,100000.0);
            pcVar3 = (char *)0x0;
            if (!_Var1) {
              pcVar3 = "Value at 100% not 100000000.0";
            }
          }
          else {
            pcVar3 = "Value at 99.999% not 100000000.0";
          }
        }
        else {
          pcVar3 = "Value at 99.99% not 1000.0";
        }
      }
      else {
        pcVar3 = "Value at 99% not 1000.0";
      }
    }
    else {
      pcVar3 = "Value at 30% not 1000.0";
    }
  }
  else {
    pcVar3 = "value_at_percentiles return should be 0";
  }
  return pcVar3;
}

Assistant:

static char* test_percentiles_by_value_at_percentiles(void)
{
    load_histograms();
    int64_t values[5] = { 0 };
    double percentiles[5] = { 30.0, 99.0, 99.99, 99.999, 100.0 };
    mu_assert(
        "value_at_percentiles return should be 0", hdr_value_at_percentiles(raw_histogram, percentiles, values, 5) == 0);
    mu_assert("Value at 30% not 1000.0", compare_percentile(values[0], 1000.0, 0.001));
    mu_assert("Value at 99% not 1000.0", compare_percentile(values[1], 1000.0, 0.001));
    mu_assert("Value at 99.99% not 1000.0", compare_percentile(values[2], 1000.0, 0.001));
    mu_assert("Value at 99.999% not 100000000.0", compare_percentile(values[3], 100000000.0, 0.001));
    mu_assert("Value at 100% not 100000000.0", compare_percentile(values[4], 100000000.0, 0.001));
    return 0;
}